

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O1

void __thiscall Funcdata::printRaw(Funcdata *this,ostream *s)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  LowlevelError *this_00;
  string local_48;
  
  if ((int)((ulong)((long)(this->bblocks).list.
                          super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->bblocks).list.
                         super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    BlockGraph::printRaw(&this->bblocks,s);
    return;
  }
  if ((this->obank).optree._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"Raw operations: \n",0x11);
    for (p_Var2 = (this->obank).optree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->obank).optree._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      poVar1 = operator<<(s,(SeqNum *)&(p_Var2[1]._M_right)->_M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\t",2);
      (**(code **)(**(long **)p_Var2[1]._M_right + 0x50))(*(long **)p_Var2[1]._M_right,s);
      std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
      std::ostream::put((char)s);
      std::ostream::flush();
    }
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"No operations to print","");
  LowlevelError::LowlevelError(this_00,&local_48);
  __cxa_throw(this_00,&RecovError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void Funcdata::printRaw(ostream &s) const

{
  if (bblocks.getSize()==0) {
    if (obank.empty())
      throw RecovError("No operations to print");
    PcodeOpTree::const_iterator iter;
    s << "Raw operations: \n";
    for(iter=obank.beginAll();iter!=obank.endAll();++iter) {
      s << (*iter).second->getSeqNum() << ":\t";
      (*iter).second->printRaw(s);
      s << endl;
    }
  }
  else
    bblocks.printRaw(s);
}